

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int *data;
  int iVar1;
  long __off;
  undefined1 local_108 [8];
  stbi__context s;
  
  s.img_buffer_original = (stbi_uc *)comp;
  __off = ftell((FILE *)f);
  data = &s.read_from_callbacks;
  s.img_n = 0x114ef7;
  s.img_out_n = 0;
  s.io.read._0_4_ = 0x114f12;
  s.io.read._4_4_ = 0;
  s.io.skip = stbi__stdio_eof;
  s.io_user_data = (void *)0x8000000001;
  s.io.eof = (_func_int_void_ptr *)f;
  s.img_buffer_end = (stbi_uc *)data;
  iVar1 = stbi__stdio_read(f,(char *)data,0x80);
  if (iVar1 == 0) {
    s.img_buffer = (stbi_uc *)((long)&s.read_from_callbacks + 1);
    s.io_user_data = (void *)((ulong)s.io_user_data & 0xffffffff00000000);
    s.read_from_callbacks._0_1_ = 0;
  }
  else {
    s.img_buffer = (stbi_uc *)((long)iVar1 + (long)data);
  }
  s.buffer_start._120_8_ = data;
  iVar1 = stbi__info_main((stbi__context *)local_108,x,y,(int *)s.img_buffer_original);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}